

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O3

int Abc_NamStrFindOrAddF(Abc_Nam_t *p,char *format,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __size;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &args[0].overflow_arg_area;
  local_f8 = 0x3000000010;
  iVar3 = (p->vBuffer).nSize;
  __size = (long)iVar3 + 1000;
  pcVar4 = (p->vBuffer).pArray;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if ((p->vBuffer).nCap < (int)__size) {
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)malloc(__size);
    }
    else {
      pcVar4 = (char *)realloc(pcVar4,__size);
      iVar3 = (p->vBuffer).nSize;
    }
    (p->vBuffer).pArray = pcVar4;
    (p->vBuffer).nCap = (int)__size;
  }
  uVar1 = vsnprintf(pcVar4 + iVar3,1000,format,&local_f8);
  if (1000 < (int)uVar1) {
    iVar3 = (p->vBuffer).nSize;
    iVar5 = uVar1 + iVar3 + 1000;
    pcVar4 = (p->vBuffer).pArray;
    if ((p->vBuffer).nCap < iVar5) {
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)malloc((long)iVar5);
      }
      else {
        pcVar4 = (char *)realloc(pcVar4,(long)iVar5);
        iVar3 = (p->vBuffer).nSize;
      }
      (p->vBuffer).pArray = pcVar4;
      (p->vBuffer).nCap = iVar5;
    }
    uVar2 = vsnprintf(pcVar4 + iVar3,(ulong)uVar1,format,&local_f8);
    if (uVar2 != uVar1) {
      __assert_fail("nSize == nAdded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                    ,0x1df,"int Abc_NamStrFindOrAddF(Abc_Nam_t *, const char *, ...)");
    }
  }
  pcVar4 = (p->vBuffer).pArray + (p->vBuffer).nSize;
  iVar3 = Abc_NamStrFindOrAddLim(p,pcVar4,pcVar4 + (int)uVar1,(int *)0x0);
  return iVar3;
}

Assistant:

int Abc_NamStrFindOrAddF( Abc_Nam_t * p, const char * format, ...  )
{
    int nAdded, nSize = 1000; 
    va_list args;  va_start( args, format );
    Vec_StrGrow( &p->vBuffer, Vec_StrSize(&p->vBuffer) + nSize );
    nAdded = vsnprintf( Vec_StrLimit(&p->vBuffer), nSize, format, args );
    if ( nAdded > nSize )
    {
        Vec_StrGrow( &p->vBuffer, Vec_StrSize(&p->vBuffer) + nAdded + nSize );
        nSize = vsnprintf( Vec_StrLimit(&p->vBuffer), nAdded, format, args );
        assert( nSize == nAdded );
    }
    va_end( args );
    return Abc_NamStrFindOrAddLim( p, Vec_StrLimit(&p->vBuffer), Vec_StrLimit(&p->vBuffer) + nAdded, NULL );
}